

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmmp.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  char **ppcVar8;
  long lVar9;
  ifstream *input_stream;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  int num_order;
  int num_mixture;
  allocator local_4c5;
  undefined4 local_4c4;
  char **local_4c0;
  vector<double,_std::allocator<double>_> variance;
  Buffer buffer;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  double log_probability;
  vector<double,_std::allocator<double>_> input_vector;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  vector<double,_std::allocator<double>_> weights;
  ostringstream error_message_5;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  num_mixture = 0x10;
  bVar2 = false;
  local_4c0 = argv;
LAB_001036a2:
  do {
    iVar5 = ya_getopt_long(argc,local_4c0,"l:m:k:fh",(option *)0x0,(int *)0x0);
    switch(iVar5) {
    case 0x66:
      bVar2 = true;
      break;
    case 0x68:
      anon_unknown.dwarf_42e6::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6b:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar12 = sptk::ConvertStringToInteger((string *)&ifs,&num_mixture);
      bVar3 = num_mixture < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar12 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -k option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_5,"gmmp",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00103bc3;
      }
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar12 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar3 = num_order < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar12 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_5,"gmmp",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_00103bc3;
      }
      num_order = num_order + -1;
      break;
    case 0x6d:
      goto switchD_001036d1_caseD_6d;
    default:
      if (iVar5 == -1) {
        lVar6 = (long)argc;
        if (argc - ya_optind == 1) {
          lVar9 = lVar6 + -1;
          pcVar10 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Just two input files, gmmfile and infile, are required"
                           );
            std::__cxx11::string::string((string *)&error_message_5,"gmmp",(allocator *)&buffer);
            sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
            goto LAB_00103bc3;
          }
          lVar9 = lVar6 + -2;
          pcVar10 = local_4c0[lVar6 + -1];
        }
        pcVar1 = local_4c0[lVar9];
        bVar3 = sptk::SetBinaryMode();
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&error_message_5,"gmmp",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_00103bc3;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&weights,(long)num_mixture,(allocator_type *)&ifs);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&mean_vectors,(long)num_mixture,(allocator_type *)&ifs);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                  (&covariance_matrices,(long)num_mixture,(allocator_type *)&ifs);
        std::ifstream::ifstream(&ifs);
        std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar1);
        if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
          poVar7 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
          std::operator<<(poVar7,pcVar1);
          std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&variance);
          sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
          goto LAB_00103a2c;
        }
        lVar11 = 0;
        lVar9 = 0;
        lVar6 = 0;
        ppcVar8 = (char **)0x0;
        iVar5 = 0;
        goto LAB_00103c0a;
      }
    case 0x67:
    case 0x69:
    case 0x6a:
      anon_unknown.dwarf_42e6::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
switchD_001036d1_caseD_6d:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
  bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
  bVar12 = num_order < 0;
  std::__cxx11::string::~string((string *)&ifs);
  if (!bVar3 || bVar12) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
    std::operator<<(poVar7,"non-negative integer");
    std::__cxx11::string::string((string *)&error_message_5,"gmmp",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_00103bc3:
    std::__cxx11::string::~string((string *)&error_message_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    return 1;
  }
  goto LAB_001036a2;
LAB_00103c0a:
  local_4c4 = (undefined4)
              CONCAT71((int7)(int3)((uint)num_mixture >> 8),(long)num_mixture <= (long)ppcVar8);
  if ((long)num_mixture <= (long)ppcVar8) goto LAB_00103a4e;
  local_4c0 = ppcVar8;
  bVar3 = sptk::ReadStream<double>
                    ((double *)
                     ((long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6),(istream *)&ifs);
  if (bVar3) {
    bVar3 = sptk::ReadStream<double>
                      (false,0,0,num_order + 1,
                       (vector<double,_std::allocator<double>_> *)
                       ((long)&((mean_vectors.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar9),(istream *)&ifs,(int *)0x0)
    ;
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to load mean vector");
      std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&variance);
      sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
      goto LAB_00103a2c;
    }
    sptk::SymmetricMatrix::Resize
              ((SymmetricMatrix *)
               ((long)&(covariance_matrices.
                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix + lVar11),
               num_order + 1);
    if (bVar2) {
      bVar3 = sptk::ReadStream((SymmetricMatrix *)
                               ((long)&(covariance_matrices.
                                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       _vptr_SymmetricMatrix + lVar11),(istream *)&ifs);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to load covariance matrix");
        std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
        goto LAB_00103a2c;
      }
    }
    else {
      variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bVar3 = sptk::ReadStream<double>(false,0,0,num_order + 1,&variance,(istream *)&ifs,(int *)0x0)
      ;
      if (bVar3) {
        sptk::SymmetricMatrix::SetDiagonal
                  ((SymmetricMatrix *)
                   ((long)&(covariance_matrices.
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   lVar11),&variance);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to load diagonal covariance vector");
        std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&input_vector);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar5 = 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&variance.super__Vector_base<double,_std::allocator<double>_>);
      if (!bVar3) goto LAB_00103a4e;
    }
    ppcVar8 = (char **)((long)local_4c0 + 1);
    lVar6 = lVar6 + 8;
    lVar9 = lVar9 + 0x18;
    lVar11 = lVar11 + 0x40;
    goto LAB_00103c0a;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
  std::operator<<((ostream *)&error_message_5,"Failed to load mixture weight");
  std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&variance);
  sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
LAB_00103a2c:
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
  iVar5 = 1;
  local_4c4 = 0;
LAB_00103a4e:
  std::ifstream::~ifstream(&ifs);
  if ((char)local_4c4 != '\0') {
    input_stream = &ifs;
    std::ifstream::ifstream(input_stream);
    if ((pcVar10 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar10),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      lVar6 = (long)num_order;
      std::vector<double,_std::allocator<double>_>::vector
                (&input_vector,lVar6 + 1U,(allocator_type *)&error_message_5);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00117b58;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      buffer._73_8_ = 0;
      iVar5 = 1;
      do {
        bVar3 = sptk::ReadStream<double>
                          (false,0,0,(int)(lVar6 + 1U),&input_vector,(istream *)input_stream,
                           (int *)0x0);
        if (!bVar3) {
          iVar5 = 0;
          goto LAB_00103f61;
        }
        bVar3 = sptk::GaussianMixtureModeling::CalculateLogProbability
                          (num_order,num_mixture,(bool)(bVar2 ^ 1),true,&input_vector,&weights,
                           &mean_vectors,&covariance_matrices,
                           (vector<double,_std::allocator<double>_> *)0x0,&log_probability,&buffer);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
          std::operator<<((ostream *)&error_message_5,"Failed to compute log-probability");
          std::__cxx11::string::string((string *)&variance,"gmmp",&local_4c5);
          sptk::PrintErrorMessage((string *)&variance,&error_message_5);
          goto LAB_00103f4a;
        }
        bVar3 = sptk::WriteStream<double>(log_probability,(ostream *)&std::cout);
      } while (bVar3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to write log-probability");
      std::__cxx11::string::string((string *)&variance,"gmmp",&local_4c5);
      sptk::PrintErrorMessage((string *)&variance,&error_message_5);
LAB_00103f4a:
      std::__cxx11::string::~string((string *)&variance);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
LAB_00103f61:
      sptk::GaussianMixtureModeling::Buffer::~Buffer(&buffer);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&input_vector.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      poVar7 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
      std::operator<<(poVar7,pcVar10);
      std::__cxx11::string::string((string *)&buffer,"gmmp",(allocator *)&variance);
      sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      iVar5 = 1;
    }
    std::ifstream::~ifstream(&ifs);
  }
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            (&covariance_matrices);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&mean_vectors);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:k:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  const bool is_diagonal(!full_covariance_flag);
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, num_order + 1, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(num_order + 1);
      if (is_diagonal) {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, num_order + 1, &variance,
                              &input_stream, NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      } else {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
      }
    }
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<double> input_vector(length);
  sptk::GaussianMixtureModeling::Buffer buffer;

  while (sptk::ReadStream(false, 0, 0, length, &input_vector, &input_stream,
                          NULL)) {
    double log_probability;
    if (!sptk::GaussianMixtureModeling::CalculateLogProbability(
            num_order, num_mixture, is_diagonal, true, input_vector, weights,
            mean_vectors, covariance_matrices, NULL, &log_probability,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to compute log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    if (!sptk::WriteStream(log_probability, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }

  return 0;
}